

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O2

void ctemplate_htmlparser::Test_Htmlparser_Error::Run(void)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  allocator local_31;
  HtmlParser html;
  string local_28;
  
  HtmlParser::HtmlParser(&html);
  lVar2 = ctemplate_htmlparser::htmlparser_get_error_msg(html.parser_);
  if (lVar2 == 0) {
    std::__cxx11::string::string
              ((string *)&local_28,"<a href=\'http://www.google.com\' \'\'>\n",&local_31);
    iVar1 = HtmlParser::Parse(&html,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    if (iVar1 == 7) {
      pcVar3 = (char *)ctemplate_htmlparser::htmlparser_get_error_msg(html.parser_);
      iVar1 = strcmp(pcVar3,"Unexpected character \'\\\'\' in state \'tag_space\'");
      if (iVar1 != 0) {
        fprintf(_stderr,"Check failed: %s\n",
                "strcmp(html.GetErrorMessage(), \"Unexpected character \'\\\\\'\' in state \'tag_space\'\") == 0"
               );
        goto LAB_001089e3;
      }
      ctemplate_htmlparser::htmlparser_reset(html.parser_);
      lVar2 = ctemplate_htmlparser::htmlparser_get_error_msg(html.parser_);
      if (lVar2 == 0) {
        HtmlParser::~HtmlParser(&html);
        return;
      }
      goto LAB_0010896d;
    }
    pcVar3 = "html.Parse(\"<a href=\'http://www.google.com\' \'\'>\\n\")";
    pcVar4 = "HtmlParser::STATE_ERROR";
  }
  else {
LAB_0010896d:
    pcVar3 = "html.GetErrorMessage()";
    pcVar4 = "(const char *)__null";
  }
  fprintf(_stderr,"Check failed: %s %s %s\n",pcVar3,"==",pcVar4);
LAB_001089e3:
  exit(1);
}

Assistant:

TEST(Htmlparser, Error) {
  HtmlParser html;

  EXPECT_EQ(html.GetErrorMessage(), (const char *)NULL);
  EXPECT_EQ(html.Parse("<a href='http://www.google.com' ''>\n"),
            HtmlParser::STATE_ERROR);

  EXPECT_STREQ(html.GetErrorMessage(),
               "Unexpected character '\\'' in state 'tag_space'");
  html.Reset();
  EXPECT_EQ(html.GetErrorMessage(), (const char *)NULL);
}